

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O2

void do_flee(CHAR_DATA *ch,char *argument)

{
  ROOM_INDEX_DATA *pRVar1;
  CHAR_DATA *ch_00;
  EXIT_DATA *pEVar2;
  ROOM_INDEX_DATA *pRVar3;
  byte bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int dir;
  AFFECT_DATA *pAVar10;
  CHAR_DATA *pCVar11;
  CHAR_DATA *ch_01;
  CProficiencies *this;
  char *pcVar12;
  CHAR_DATA **ppCVar13;
  int local_1254;
  char arg [4608];
  
  pCVar11 = ch->fighting;
  if (pCVar11 == (CHAR_DATA *)0x0) {
    if (ch->position == 7) {
      ch->position = 8;
    }
    send_to_char("You aren\'t fighting anyone.\n\r",ch);
    return;
  }
  pAVar10 = check_bind(ch,"legs");
  if (pAVar10 != (AFFECT_DATA *)0x0) {
    act("$n attempts to flee but $s bindings cause $m to trip up and fall!",ch,(void *)0x0,
        (void *)0x0,0);
    act("You attempt to flee but your bindings cause you to trip up and fall!",ch,(void *)0x0,
        (void *)0x0,3);
    WAIT_STATE(ch,0xc);
    check_parting_blow(ch,pCVar11);
    return;
  }
  bVar5 = check_entwine(ch,1);
  if ((bVar5) || (bVar5 = check_entwine(ch,2), bVar5)) {
    act("You are too tightly entwined to escape!",ch,(void *)0x0,(void *)0x0,3);
    return;
  }
  bVar5 = check_entwine(ch,0);
  if (bVar5) {
    do_uncoil(ch,"");
  }
  bVar5 = is_affected(ch,(int)gsn_web);
  if ((bVar5) && (iVar7 = number_percent(), 0x3c < iVar7)) {
    act("$n tries to flee, but the webs $e\'s entangled in cause $m to trip up and fall!",ch,
        (void *)0x0,(void *)0x0,0);
    act("You try to flee, but the webs you are entangled in cause you to trip up and fall!",ch,
        (void *)0x0,(void *)0x0,3);
    check_parting_blow(ch,pCVar11);
    WAIT_STATE(ch,0xc);
    return;
  }
  one_argument(argument,arg);
  iVar8 = get_skill(ch,(int)gsn_escape);
  iVar7 = 0x5a;
  if (iVar8 < 0x5a) {
    iVar7 = iVar8;
  }
  if (arg[0] == '\0') {
    local_1254 = 10;
    bVar5 = true;
  }
  else {
    bVar6 = str_prefix(arg,"north");
    bVar5 = false;
    local_1254 = 0;
    if (bVar6) {
      bVar5 = str_prefix(arg,"east");
      if (bVar5) {
        bVar5 = str_prefix(arg,"south");
        if (bVar5) {
          bVar5 = str_prefix(arg,"west");
          if (bVar5) {
            bVar5 = str_prefix(arg,"up");
            if (bVar5) {
              bVar5 = str_prefix(arg,"down");
              local_1254 = (uint)bVar5 + (uint)bVar5 * 4 + 5;
              goto LAB_002ee6fe;
            }
            local_1254 = 4;
          }
          else {
            local_1254 = 3;
          }
          bVar5 = false;
        }
        else {
          bVar5 = false;
          local_1254 = 2;
        }
      }
      else {
        bVar5 = false;
        local_1254 = 1;
      }
    }
  }
LAB_002ee6fe:
  pRVar1 = ch->in_room;
  ppCVar13 = &pRVar1->people;
  while( true ) {
    ch_00 = *ppCVar13;
    bVar4 = 1;
    if (ch_00 == (CHAR_DATA *)0x0) break;
    bVar6 = is_npc(ch_00);
    if ((((!bVar6) && (bVar6 = is_affected(ch_00,(int)gsn_rage), bVar6)) &&
        (ch_00->pcdata->tribe == 10)) && (ch_00->fighting == ch)) {
      bVar6 = is_npc(ch_00);
      if ((bVar6) || (iVar8 = number_percent(), 0x1e < iVar8)) {
        bVar4 = 0;
      }
      break;
    }
    ppCVar13 = &ch_00->next_in_room;
  }
  iVar8 = 6;
  do {
    bVar6 = iVar8 == 0;
    iVar8 = iVar8 + -1;
    if (bVar6) {
      pcVar12 = "PANIC! You couldn\'t escape!\n\r";
      goto LAB_002ee865;
    }
    if ((bVar5 != false) || (iVar9 = number_percent(), dir = local_1254, iVar7 < iVar9)) {
      dir = number_door();
    }
    pEVar2 = pRVar1->exit[dir];
  } while ((((pEVar2 == (EXIT_DATA *)0x0) || ((pEVar2->u1).to_room == (ROOM_INDEX_DATA *)0x0)) ||
           (((pEVar2->exit_info[0] & 2) != 0 && (bVar6 = is_affected_by(ch,0x14), !bVar6)))) ||
          ((bVar6 = is_npc(ch), bVar6 && ((((pEVar2->u1).to_room)->room_flags[0] & 4) != 0))));
  bVar6 = outflank_me(ch,dir);
  if ((!bVar6) && (bVar6 = check_parting_blow(ch,pCVar11), !bVar6)) {
    bVar6 = is_carrying_type(ch,0x16);
    if (((!bVar6) && (((ch->in_room->exit[dir]->u1).to_room)->sector_type == 6)) &&
       (bVar6 = is_affected_by(ch,0x13), !bVar6)) {
      if (ch->pcdata == (PC_DATA *)0x0) {
        this = &prof_none;
      }
      else {
        this = &ch->pcdata->profs;
      }
      bVar6 = CProficiencies::HasProf(this,(int)psn_swimming);
      if (!bVar6) {
        pcVar12 = "You need a boat to go there.\n\r";
LAB_002ee865:
        send_to_char(pcVar12,ch);
        return;
      }
    }
    stop_fighting(ch,true);
    move_char(ch,dir,false,true);
    pRVar3 = ch->in_room;
    if (pRVar3 == pRVar1) {
      set_fighting(pCVar11,ch);
      set_fighting(ch,pCVar11);
    }
    else {
      ch->last_fought = (CHAR_DATA *)0x0;
      ch->batter = 0;
      ch->in_room = pRVar1;
      act("$n has fled!",ch,(void *)0x0,(void *)0x0,0);
      bVar6 = is_npc(ch);
      if (((!bVar6) && (send_to_char("You flee from combat!\n\r",ch), bVar5 == false)) &&
         (iVar7 = get_skill(ch,(int)gsn_escape), 2 < iVar7)) {
        check_improve(ch,(int)gsn_escape,true,1);
      }
      if ((bool)(ch_00 == (CHAR_DATA *)0x0 | bVar4)) {
        ch->in_room = pRVar3;
      }
      else {
        bVar5 = is_npc(ch_00);
        if (!bVar5) {
          act("$n unleashes a loud roar and leaps after $N!",ch_00,(void *)0x0,ch,1);
          act("Sensing $n\'s fear as $e turns to flee, you roar and leap after $m!",ch,(void *)0x0,
              ch_00,2);
        }
        ch->in_room = pRVar3;
        move_char(ch_00,dir,false,true);
        if (ch_00->in_room == ch->in_room) {
          bVar5 = is_npc(ch_00);
          if (bVar5) {
            pcVar12 = "$n runs into the room screaming, $N latched to $s face!";
            pCVar11 = ch_00;
            ch_01 = ch;
          }
          else {
            pcVar12 = "$n chases $N into the room, leaping upon $M!";
            pCVar11 = ch;
            ch_01 = ch_00;
          }
          act(pcVar12,ch_01,(void *)0x0,pCVar11,1);
          send_to_char("You flee, but the worm is still attached to your face!\n\r",ch);
          WAIT_STATE(ch,0xc);
          one_hit(ch_00,ch,-1);
        }
      }
    }
  }
  return;
}

Assistant:

void do_flee(CHAR_DATA *ch, char *argument)
{
	ROOM_INDEX_DATA *was_in;
	ROOM_INDEX_DATA *now_in;
	CHAR_DATA *victim, *panther;
	char arg[MAX_INPUT_LENGTH];
	int attempt, chance, dir;
	bool pounced = false;

	victim = ch->fighting;

	if (victim == nullptr)
	{
		if (ch->position == POS_FIGHTING)
			ch->position = POS_STANDING;

		send_to_char("You aren't fighting anyone.\n\r", ch);
		return;
	}

	if (check_bind(ch, "legs"))
	{
		act("$n attempts to flee but $s bindings cause $m to trip up and fall!", ch, 0, 0, TO_ROOM);
		act("You attempt to flee but your bindings cause you to trip up and fall!", ch, 0, 0, TO_CHAR);
		WAIT_STATE(ch, PULSE_VIOLENCE);
		check_parting_blow(ch, victim);
		return;
	}

	if (check_entwine(ch, 1) || check_entwine(ch, 2))
	{
		act("You are too tightly entwined to escape!", ch, nullptr, nullptr, TO_CHAR);
		return;
	}

	if (check_entwine(ch, 0))
		do_uncoil(ch, "");

	if (is_affected(ch, gsn_web) && number_percent() > 60)
	{
		act("$n tries to flee, but the webs $e's entangled in cause $m to trip up and fall!", ch, 0, 0, TO_ROOM);
		act("You try to flee, but the webs you are entangled in cause you to trip up and fall!", ch, 0, 0, TO_CHAR);
		check_parting_blow(ch, victim);
		WAIT_STATE(ch, PULSE_VIOLENCE);
		return;
	}

	one_argument(argument, arg);

	chance = get_skill(ch, gsn_escape);

	if (chance > 90)
		chance = 90;

	dir = 10;

	if (arg[0] == '\0')
		dir = 10;
	else if (!str_prefix(arg, "north"))
		dir = 0;
	else if (!str_prefix(arg, "east"))
		dir = 1;
	else if (!str_prefix(arg, "south"))
		dir = 2;
	else if (!str_prefix(arg, "west"))
		dir = 3;
	else if (!str_prefix(arg, "up"))
		dir = 4;
	else if (!str_prefix(arg, "down"))
		dir = 5;
	else
		dir = 10;

	was_in = ch->in_room;

	for (panther = ch->in_room->people; panther; panther = panther->next_in_room)
	{
		if (!is_npc(panther)
			&& is_affected(panther, gsn_rage)
			&& panther->pcdata->tribe == TRIBE_PANTHER
			&& panther->fighting == ch)
		{
			break;
		}
	}

	if ((panther && is_npc(panther)) || (panther && number_percent() > 30))
		pounced = true;

	for (attempt = 0; attempt < 6; attempt++)
	{
		EXIT_DATA *pexit;
		int door;

		if (dir == 10 || number_percent() > chance)
			door = number_door();
		else
			door = dir;

		pexit = was_in->exit[door];

		if (pexit == 0
			|| pexit->u1.to_room == nullptr
			|| (IS_SET(pexit->exit_info, EX_CLOSED) && !is_affected_by(ch, AFF_PASS_DOOR))
			|| (is_npc(ch) && IS_SET(pexit->u1.to_room->room_flags, ROOM_NO_MOB)))
		{
			continue;
		}

		if (outflank_me(ch, door))
			return;

		if (check_parting_blow(ch, victim)) // true = died to parting blow
			return;

		if (!is_carrying_type(ch, ITEM_BOAT)
			&& ch->in_room->exit[door]->u1.to_room->sector_type == SECT_WATER
			&& !is_affected_by(ch, AFF_FLYING)
			&& !ch->Profs()->HasProf(psn_swimming))
		{
			send_to_char("You need a boat to go there.\n\r", ch);
			return;
		}

		stop_fighting(ch, true);

		move_char(ch, door, false, true);

		now_in = ch->in_room;

		if (now_in == was_in)
		{
			set_fighting(victim, ch);
			set_fighting(ch, victim); // to stop people from walking away
			return;
		}

		ch->last_fought = nullptr;
		ch->batter = 0;
		ch->in_room = was_in;

		act("$n has fled!", ch, nullptr, nullptr, TO_ROOM);

		if (!is_npc(ch))
		{
			send_to_char("You flee from combat!\n\r", ch);

			if (dir != 10 && get_skill(ch, gsn_escape) > 2)
				check_improve(ch, gsn_escape, 2, true);
		}

		if (panther && pounced && !is_npc(panther))
		{
			act("$n unleashes a loud roar and leaps after $N!", panther, 0, ch, TO_NOTVICT);
			act("Sensing $n's fear as $e turns to flee, you roar and leap after $m!", ch, 0, panther, TO_VICT);
		}

		/*
		if(panther && is_npc(panther))
		{
			act("$n flees the room, $N still stuck to $s face!",ch,0,panther,TO_NOTVICT);
		}
		*/

		ch->in_room = now_in;

		if (panther && pounced)
		{
			move_char(panther, door, false, true);

			if (panther->in_room != ch->in_room)
				return;

			if (!is_npc(panther))
				act("$n chases $N into the room, leaping upon $M!", panther, 0, ch, TO_NOTVICT);
			else
				act("$n runs into the room screaming, $N latched to $s face!", ch, 0, panther, TO_NOTVICT);

			send_to_char("You flee, but the worm is still attached to your face!\n\r", ch);
			WAIT_STATE(ch, PULSE_VIOLENCE);
			one_hit(panther, ch, TYPE_UNDEFINED);
		}

		return;
	}

	send_to_char("PANIC! You couldn't escape!\n\r", ch);
}